

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  byte *pbVar1;
  uchar filterType;
  size_t sVar2;
  bool bVar3;
  undefined1 auVar4 [32];
  uint uVar5;
  uchar *puVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uchar *puVar16;
  long lVar17;
  ulong uVar18;
  uchar *puVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  bool bVar25;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float fVar39;
  undefined1 in_XMM17 [16];
  undefined8 *in_stack_00000008;
  uchar *dummy;
  size_t size [5];
  uchar *attempt [5];
  uint count [256];
  uchar *local_508;
  uchar *local_4e8;
  ulong local_4e0;
  size_t local_4d8 [6];
  undefined1 local_4a8 [64];
  long alStack_468 [6];
  undefined1 local_438 [40];
  void *pvStack_410;
  ulong length;
  undefined1 auVar26 [16];
  undefined1 auVar29 [32];
  
  uVar9 = (ulong)h;
  iVar21 = 0;
  if ((uint)info < 7) {
    iVar21 = *(int *)(&DAT_00a26b84 + ((ulong)info & 0xffffffff) * 4);
  }
  iVar21 = iVar21 * (uint)settings;
  if (iVar21 == 0) {
    uVar5 = 0x1f;
  }
  else {
    uVar5 = *(uint *)(in_stack_00000008 + 7);
    if ((uint)settings < 8) {
      uVar5 = 0;
    }
    if ((uint)info == 3) {
      uVar5 = 0;
    }
    if (*(int *)((long)in_stack_00000008 + 0x34) == 0) {
      uVar5 = *(uint *)(in_stack_00000008 + 7);
    }
    if (uVar5 < 5) {
      uVar15 = (ulong)(iVar21 + 7U >> 3);
      uVar12 = w * iVar21 + 7;
      uVar24 = uVar12 >> 3;
      length = (ulong)uVar24;
      switch(uVar5) {
      case 0:
        if (h != 0) {
          puVar16 = out + 1;
          uVar15 = 0;
          do {
            out[(length + 1) * uVar15] = '\0';
            if (7 < uVar12) {
              uVar14 = 0;
              do {
                puVar16[uVar14] = in[uVar14];
                uVar14 = uVar14 + 1;
              } while (length != uVar14);
            }
            uVar15 = uVar15 + 1;
            puVar16 = puVar16 + length + 1;
            in = in + length;
          } while (uVar15 != uVar9);
        }
        break;
      case 1:
        lVar22 = 0;
        do {
          pvVar7 = malloc(length);
          *(void **)(local_438 + lVar22 * 8) = pvVar7;
          if (pvVar7 == (void *)0x0) {
            return 0x53;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 5);
        if (h != 0) {
          puVar16 = out + 1;
          uVar23 = 0;
          local_508 = (uchar *)0x0;
          uVar18 = 0;
          auVar36 = vpbroadcastq_avx512f();
          uVar14 = 0;
          uVar20 = (ulong)(uVar24 - 1) + 8 & 0xfffffffffffffff8;
          local_4a8 = vmovdqu64_avx512f(auVar36);
          local_4e0 = uVar9;
          do {
            lVar22 = uVar23 * length;
            uVar9 = 0;
LAB_004d50f3:
            do {
              uVar13 = uVar9;
              uVar11 = uVar18;
              uVar8 = uVar14;
              puVar19 = *(uchar **)(local_438 + uVar13 * 8);
              filterScanline(puVar19,in + lVar22,local_508,length,uVar15,(uchar)uVar13);
              if (uVar13 == 0) {
                auVar36 = vmovdqu64_avx512f(local_4a8);
                auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                uVar14 = 0;
                uVar18 = 0;
                uVar9 = 1;
                if (uVar12 < 8) goto LAB_004d50f3;
                auVar37 = ZEXT1664((undefined1  [16])0x0);
                uVar9 = 0;
                do {
                  auVar32 = vpbroadcastq_avx512f();
                  auVar33 = vmovdqa64_avx512f(auVar37);
                  auVar37 = vporq_avx512f(auVar32,auVar38);
                  uVar14 = vpcmpuq_avx512f(auVar37,auVar36,2);
                  auVar26 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(puVar19 + uVar9));
                  auVar28[1] = ((byte)(uVar14 >> 1) & 1) * auVar26[1];
                  auVar28[0] = ((byte)uVar14 & 1) * auVar26[0];
                  auVar28[2] = ((byte)(uVar14 >> 2) & 1) * auVar26[2];
                  auVar28[3] = ((byte)(uVar14 >> 3) & 1) * auVar26[3];
                  auVar28[4] = ((byte)(uVar14 >> 4) & 1) * auVar26[4];
                  auVar28[5] = ((byte)(uVar14 >> 5) & 1) * auVar26[5];
                  auVar28[6] = ((byte)(uVar14 >> 6) & 1) * auVar26[6];
                  auVar28[7] = (char)(uVar14 >> 7) * auVar26[7];
                  auVar28._8_8_ = 0;
                  uVar9 = uVar9 + 8;
                  auVar37 = vpmovzxbq_avx512f(auVar28);
                  auVar37 = vpaddq_avx512f(auVar33,auVar37);
                } while (uVar20 != uVar9);
LAB_004d520a:
                auVar36 = vmovdqa64_avx512f(auVar37);
                bVar3 = (bool)((byte)uVar14 & 1);
                auVar37._0_8_ = (ulong)bVar3 * auVar36._0_8_ | (ulong)!bVar3 * auVar33._0_8_;
                bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
                auVar37._8_8_ = (ulong)bVar3 * auVar36._8_8_ | (ulong)!bVar3 * auVar33._8_8_;
                bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
                auVar37._16_8_ = (ulong)bVar3 * auVar36._16_8_ | (ulong)!bVar3 * auVar33._16_8_;
                bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
                auVar37._24_8_ = (ulong)bVar3 * auVar36._24_8_ | (ulong)!bVar3 * auVar33._24_8_;
                bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
                auVar37._32_8_ = (ulong)bVar3 * auVar36._32_8_ | (ulong)!bVar3 * auVar33._32_8_;
                bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
                auVar37._40_8_ = (ulong)bVar3 * auVar36._40_8_ | (ulong)!bVar3 * auVar33._40_8_;
                bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
                auVar37._48_8_ = (ulong)bVar3 * auVar36._48_8_ | (ulong)!bVar3 * auVar33._48_8_;
                auVar37._56_8_ =
                     (uVar14 >> 7) * auVar36._56_8_ | (ulong)!SUB81(uVar14 >> 7,0) * auVar33._56_8_;
                auVar31 = vextracti64x4_avx512f(auVar37,1);
                auVar36 = vpaddq_avx512f(auVar37,ZEXT3264(auVar31));
                auVar26 = vpaddq_avx(auVar36._0_16_,auVar36._16_16_);
                auVar28 = vpshufd_avx(auVar26,0xee);
                auVar26 = vpaddq_avx(auVar26,auVar28);
                uVar14 = auVar26._0_8_;
                if (uVar13 != 0) goto LAB_004d523a;
                uVar18 = 0;
              }
              else {
                auVar36 = vmovdqu64_avx512f(local_4a8);
                auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                if (7 < uVar12) {
                  auVar31._8_4_ = 0xff;
                  auVar31._0_8_ = 0xff000000ff;
                  auVar31._12_4_ = 0xff;
                  auVar31._16_4_ = 0xff;
                  auVar31._20_4_ = 0xff;
                  auVar31._24_4_ = 0xff;
                  auVar31._28_4_ = 0xff;
                  auVar37 = ZEXT1664((undefined1  [16])0x0);
                  uVar9 = 0;
                  do {
                    auVar32 = vpbroadcastq_avx512f();
                    auVar33 = vmovdqa64_avx512f(auVar37);
                    auVar37 = vporq_avx512f(auVar32,auVar38);
                    uVar14 = vpcmpuq_avx512f(auVar37,auVar36,2);
                    auVar26 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(puVar19 + uVar9));
                    auVar27[1] = ((byte)(uVar14 >> 1) & 1) * auVar26[1];
                    auVar27[0] = ((byte)uVar14 & 1) * auVar26[0];
                    auVar27[2] = ((byte)(uVar14 >> 2) & 1) * auVar26[2];
                    auVar27[3] = ((byte)(uVar14 >> 3) & 1) * auVar26[3];
                    auVar27[4] = ((byte)(uVar14 >> 4) & 1) * auVar26[4];
                    auVar27[5] = ((byte)(uVar14 >> 5) & 1) * auVar26[5];
                    auVar27[6] = ((byte)(uVar14 >> 6) & 1) * auVar26[6];
                    auVar27[7] = (char)(uVar14 >> 7) * auVar26[7];
                    auVar27._8_8_ = 0;
                    uVar9 = uVar9 + 8;
                    auVar4 = vpmovzxbd_avx2(auVar27);
                    uVar18 = vpmovb2m_avx512vl(auVar27);
                    auVar29 = vpxord_avx512vl(auVar4,auVar31);
                    bVar3 = (bool)((byte)uVar18 & 1);
                    auVar30._0_4_ = (uint)bVar3 * auVar29._0_4_ | (uint)!bVar3 * auVar4._0_4_;
                    bVar3 = (bool)((byte)(uVar18 >> 1) & 1);
                    auVar30._4_4_ = (uint)bVar3 * auVar29._4_4_ | (uint)!bVar3 * auVar4._4_4_;
                    bVar3 = (bool)((byte)(uVar18 >> 2) & 1);
                    auVar30._8_4_ = (uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * auVar4._8_4_;
                    bVar3 = (bool)((byte)(uVar18 >> 3) & 1);
                    auVar30._12_4_ = (uint)bVar3 * auVar29._12_4_ | (uint)!bVar3 * auVar4._12_4_;
                    bVar3 = (bool)((byte)(uVar18 >> 4) & 1);
                    auVar30._16_4_ = (uint)bVar3 * auVar29._16_4_ | (uint)!bVar3 * auVar4._16_4_;
                    bVar3 = (bool)((byte)(uVar18 >> 5) & 1);
                    auVar30._20_4_ = (uint)bVar3 * auVar29._20_4_ | (uint)!bVar3 * auVar4._20_4_;
                    bVar3 = (bool)((byte)(uVar18 >> 6) & 1);
                    auVar30._24_4_ = (uint)bVar3 * auVar29._24_4_ | (uint)!bVar3 * auVar4._24_4_;
                    bVar3 = (bool)((byte)(uVar18 >> 7) & 1);
                    auVar30._28_4_ = (uint)bVar3 * auVar29._28_4_ | (uint)!bVar3 * auVar4._28_4_;
                    auVar37 = vpmovzxdq_avx512f(auVar30);
                    auVar37 = vpaddq_avx512f(auVar33,auVar37);
                  } while (uVar20 != uVar9);
                  goto LAB_004d520a;
                }
                uVar14 = 0;
LAB_004d523a:
                if (uVar14 < uVar8) {
                  uVar11 = uVar13;
                  uVar8 = uVar14;
                }
                uVar14 = uVar8;
                uVar18 = uVar11 & 0xff;
              }
              uVar9 = uVar13 + 1;
            } while (uVar13 + 1 != 5);
            out[(length + 1) * uVar23] = (uchar)uVar18;
            if (7 < uVar12) {
              lVar10 = 0;
              lVar17 = *(long *)(local_438 + uVar18 * 8);
              do {
                puVar16[lVar10] = *(uchar *)(lVar17 + lVar10);
                lVar10 = lVar10 + 1;
              } while (uVar24 != (uint)lVar10);
            }
            uVar23 = uVar23 + 1;
            puVar16 = puVar16 + length + 1;
            local_508 = in + lVar22;
          } while (uVar23 != local_4e0);
        }
        lVar22 = 0;
        do {
          free(*(void **)(local_438 + lVar22 * 8));
          lVar22 = lVar22 + 1;
        } while (lVar22 != 5);
        break;
      case 2:
        lVar22 = 0;
        do {
          pvVar7 = malloc(length);
          local_4d8[lVar22] = (size_t)pvVar7;
          if (pvVar7 == (void *)0x0) {
            return 0x53;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 5);
        if (h != 0) {
          puVar16 = out + 1;
          auVar36 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar18 = 0;
          uVar14 = 0;
          local_4a8._0_8_ = length + 1;
          puVar19 = (uchar *)0x0;
          do {
            lVar22 = uVar18 * length;
            uVar20 = 0;
            do {
              puVar6 = (uchar *)local_4d8[uVar20];
              filterScanline(puVar6,in + lVar22,puVar19,length,uVar15,(uchar)uVar20);
              memset(local_438,0,0x400);
              if (7 < uVar12) {
                lVar17 = 0;
                do {
                  pbVar1 = puVar6 + lVar17;
                  lVar17 = lVar17 + 1;
                  *(int *)(local_438 + (ulong)*pbVar1 * 4) =
                       *(int *)(local_438 + (ulong)*pbVar1 * 4) + 1;
                } while (uVar24 != (uint)lVar17);
              }
              *(int *)(local_438 + uVar20 * 4) = *(int *)(local_438 + uVar20 * 4) + 1;
              fVar34 = 0.0;
              lVar17 = 0;
              do {
                fVar35 = 0.0;
                if (*(int *)(local_438 + lVar17 * 4) != 0) {
                  auVar26 = vcvtusi2ss_avx512f(in_XMM17,*(int *)(local_438 + lVar17 * 4));
                  auVar38 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar35 = auVar26._0_4_ / (float)(length + 1);
                  for (fVar39 = 1.0 / fVar35; 32.0 < fVar39; fVar39 = fVar39 * 0.0625) {
                    auVar38 = ZEXT464((uint)(auVar38._0_4_ + 4.0));
                  }
                  for (; 2.0 < fVar39; fVar39 = fVar39 * 0.5) {
                    auVar38 = ZEXT464((uint)(auVar38._0_4_ + 1.0));
                  }
                  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((fVar39 * fVar39 * fVar39) / 3.0 +
                                                          fVar39 * fVar39 * 3.0 * -0.5)),
                                            SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar39));
                  in_ZmmResult._0_16_ =
                       vfmadd132ss_avx512f(ZEXT416((uint)(auVar26._0_4_ + -1.83333)),auVar38._0_16_,
                                           ZEXT416(0x3fb8aa3b));
                  fVar35 = fVar35 * in_ZmmResult._0_4_;
                }
                fVar34 = fVar35 + fVar34;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 0x100);
              bVar25 = uVar20 == 0;
              bVar3 = fVar34 < auVar36._0_4_;
              if (bVar3 || bVar25) {
                uVar14 = uVar20 & 0xffffffff;
              }
              uVar20 = uVar20 + 1;
              auVar38._16_48_ = in_ZmmResult._16_48_;
              auVar38._0_16_ = auVar36._0_16_;
              in_ZmmResult._4_60_ = auVar38._4_60_;
              in_ZmmResult._0_4_ =
                   (uint)(bVar3 || bVar25) * (int)fVar34 +
                   (uint)(!bVar3 && !bVar25) * (int)auVar36._0_4_;
              auVar36 = ZEXT1664(in_ZmmResult._0_16_);
            } while (uVar20 != 5);
            out[local_4a8._0_8_ * uVar18] = (uchar)uVar14;
            if (7 < uVar12) {
              sVar2 = local_4d8[uVar14];
              lVar17 = 0;
              do {
                puVar16[lVar17] = *(uchar *)(sVar2 + lVar17);
                lVar17 = lVar17 + 1;
              } while (uVar24 != (uint)lVar17);
            }
            puVar16 = puVar16 + local_4a8._0_8_;
            uVar18 = uVar18 + 1;
            puVar19 = in + lVar22;
          } while (uVar18 != uVar9);
        }
        lVar22 = 0;
        do {
          free((void *)local_4d8[lVar22]);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 5);
        break;
      case 3:
        local_438._8_8_ = in_stack_00000008[1];
        local_438._16_8_ = in_stack_00000008[2];
        pvStack_410 = (void *)in_stack_00000008[5];
        lVar22 = 0;
        local_438._4_4_ = (undefined4)((ulong)*in_stack_00000008 >> 0x20);
        local_438._0_4_ = 1;
        local_438._24_16_ = (undefined1  [16])0x0;
        do {
          pvVar7 = malloc(length);
          alStack_468[lVar22] = (long)pvVar7;
          if (pvVar7 == (void *)0x0) {
            return 0x53;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 5);
        if (h != 0) {
          uVar18 = 0;
          uVar20 = 0;
          uVar14 = 0;
          local_508 = (uchar *)0x0;
          puVar16 = out + 1;
          do {
            lVar17 = uVar18 * length;
            local_4a8._0_8_ = puVar16;
            uVar23 = 0;
            lVar22 = 0;
            do {
              puVar16 = (uchar *)alStack_468[uVar23];
              filterScanline(puVar16,in + lVar17,local_508,length,uVar15,(uchar)uVar23);
              local_4d8[uVar23] = 0;
              local_4e8 = (uchar *)0x0;
              if ((_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                   *)local_438._24_8_ ==
                  (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                   *)0x0) {
                lodepng_zlib_compress
                          (&local_4e8,(size_t *)((long)local_4d8 + lVar22),puVar16,length,
                           (LodePNGCompressSettings *)local_438);
              }
              else {
                (*(code *)local_438._24_8_)
                          (&local_4e8,(size_t *)((long)local_4d8 + lVar22),puVar16,length,
                           (LodePNGCompressSettings *)local_438);
              }
              free(local_4e8);
              if (local_4d8[uVar23] < uVar14 || uVar23 == 0) {
                uVar20 = uVar23 & 0xffffffff;
                uVar14 = local_4d8[uVar23];
              }
              uVar23 = uVar23 + 1;
              lVar22 = lVar22 + 8;
            } while (uVar23 != 5);
            out[(length + 1) * uVar18] = (uchar)uVar20;
            if (7 < uVar12) {
              lVar22 = alStack_468[uVar20];
              lVar10 = 0;
              do {
                *(undefined1 *)(local_4a8._0_8_ + lVar10) = *(undefined1 *)(lVar22 + lVar10);
                lVar10 = lVar10 + 1;
              } while (uVar24 != (uint)lVar10);
            }
            uVar18 = uVar18 + 1;
            puVar16 = (uchar *)(local_4a8._0_8_ + length + 1);
            local_508 = in + lVar17;
          } while (uVar18 != uVar9);
        }
        lVar22 = 0;
        do {
          free((void *)alStack_468[lVar22]);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 5);
        break;
      case 4:
        if (h != 0) {
          puVar19 = out + 1;
          uVar14 = 0;
          puVar16 = (uchar *)0x0;
          do {
            puVar6 = in;
            filterType = *(uchar *)(in_stack_00000008[8] + uVar14);
            puVar19[-1] = filterType;
            filterScanline(puVar19,puVar6,puVar16,length,uVar15,filterType);
            puVar19 = puVar19 + length + 1;
            uVar14 = uVar14 + 1;
            in = puVar6 + length;
            puVar16 = puVar6;
          } while (uVar9 != uVar14);
        }
      }
      uVar5 = 0;
    }
    else {
      uVar5 = 0x58;
    }
  }
  return uVar5;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = linebytes;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}